

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::anon_unknown_7::LineBufferTaskIIF::getWritePointer<half>
          (LineBufferTaskIIF *this,int y,unsigned_short **outWritePointerRight,
          size_t *outPixelsToCopySSE,size_t *outPixelsToCopyNormal,int channelBank)

{
  pointer psVar1;
  pointer psVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  
  psVar2 = (this->_ifd->optimizationData).
           super__Vector_base<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = ((long)(this->_ifd->optimizationData).
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2) / 0x38;
  uVar10 = 0;
  if (channelBank == 1) {
    uVar10 = uVar9 >> 1;
  }
  psVar1 = psVar2 + uVar10;
  iVar6 = Imath_2_5::modp(y,psVar2[uVar10].ySampling);
  if (iVar6 != 0) {
    *outPixelsToCopySSE = 0;
    *outPixelsToCopyNormal = 0;
    *outWritePointerRight = (unsigned_short *)0x0;
  }
  uVar10 = uVar9 >> 1;
  if (uVar9 < 5) {
    uVar10 = uVar9;
  }
  pcVar3 = psVar1->base;
  iVar6 = Imath_2_5::divp(y,psVar1->ySampling);
  sVar4 = psVar1->yStride;
  iVar7 = Imath_2_5::divp(this->_ifd->minX,psVar1->xSampling);
  iVar8 = Imath_2_5::divp(this->_ifd->maxX,psVar1->xSampling);
  sVar5 = psVar1->xStride;
  *outWritePointerRight = (unsigned_short *)(pcVar3 + (long)iVar6 * sVar4 + sVar5 * (long)iVar7);
  uVar10 = (((long)iVar8 - (long)iVar7) * sVar5 + 2 >> 1) / uVar10 + 1;
  *outPixelsToCopySSE = uVar10 >> 3;
  *outPixelsToCopyNormal = (ulong)((uint)uVar10 & 7);
  return;
}

Assistant:

void LineBufferTaskIIF::getWritePointer 
                            (int y,
                             unsigned short*& outWritePointerRight,
                             size_t& outPixelsToCopySSE,
                             size_t& outPixelsToCopyNormal,
                             int channelBank
                            ) const
{
      // Channels are saved alphabetically, so the order is B G R.
      // The last slice (R) will give us the location of our write pointer.
      // The only slice that we support skipping is alpha, i.e. the first one.  
      // This does not impact the write pointer or the pixels to copy at all.
      
      size_t nbSlicesInBank = _ifd->optimizationData.size();
      
      int sizeOfSingleValue = sizeof(TYPE);
      
      if(_ifd->optimizationData.size()>4)
      {
          // there are two banks - we only copy one at once
          nbSlicesInBank/=2;
      }

      
      size_t firstChannel = 0;
      if(channelBank==1)
      {
          firstChannel = _ifd->optimizationData.size()/2;
      }
      
       sliceOptimizationData& firstSlice = _ifd->optimizationData[firstChannel];
      
      if (modp (y, firstSlice.ySampling) != 0)
      {
          outPixelsToCopySSE    = 0;
          outPixelsToCopyNormal = 0;
          outWritePointerRight  = 0;
      }
      
      const char* linePtr1  = firstSlice.base +
      divp (y, firstSlice.ySampling) *
      firstSlice.yStride;
      
      int dMinX1 = divp (_ifd->minX, firstSlice.xSampling);
      int dMaxX1 = divp (_ifd->maxX, firstSlice.xSampling);
      
      // Construct the writePtr so that we start writing at
      // linePtr + Min offset in the line.
      outWritePointerRight =  (unsigned short*)(linePtr1 +
      dMinX1 * firstSlice.xStride );
      
      size_t bytesToCopy  = ((linePtr1 + dMaxX1 * firstSlice.xStride ) -
      (linePtr1 + dMinX1 * firstSlice.xStride )) + 2;
      size_t shortsToCopy = bytesToCopy / sizeOfSingleValue;
      size_t pixelsToCopy = (shortsToCopy / nbSlicesInBank ) + 1;
      
      // We only support writing to SSE if we have no pixels to copy normally
      outPixelsToCopySSE    = pixelsToCopy / 8;
      outPixelsToCopyNormal = pixelsToCopy % 8;
      
}